

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

const_iterator __thiscall libcellml::Model::ModelImpl::findUnits(ModelImpl *this,UnitsPtr *units)

{
  bool bVar1;
  shared_ptr<libcellml::Units> local_60;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_50;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_48;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_40;
  shared_ptr<libcellml::Units> *local_38;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_30;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  local_28;
  __normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
  result;
  UnitsPtr *units_local;
  ModelImpl *this_local;
  
  result._M_current = units;
  local_30._M_current =
       (shared_ptr<libcellml::Units> *)
       std::
       vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ::begin(&this->mUnits);
  local_38 = (shared_ptr<libcellml::Units> *)
             std::
             vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             ::end(&this->mUnits);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,std::shared_ptr<libcellml::Units>>
                       (local_30,(__normal_iterator<const_std::shared_ptr<libcellml::Units>_*,_std::vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>_>
                                  )local_38,result._M_current);
  local_40._M_current =
       (shared_ptr<libcellml::Units> *)
       std::
       vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ::end(&this->mUnits);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_40);
  if (bVar1) {
    this_local = (ModelImpl *)local_28._M_current;
  }
  else {
    local_48._M_current =
         (shared_ptr<libcellml::Units> *)
         std::
         vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         ::begin(&this->mUnits);
    local_50._M_current =
         (shared_ptr<libcellml::Units> *)
         std::
         vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
         ::end(&this->mUnits);
    std::shared_ptr<libcellml::Units>::shared_ptr(&local_60,result._M_current);
    this_local = (ModelImpl *)
                 std::
                 find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<libcellml::Units>const*,std::vector<std::shared_ptr<libcellml::Units>,std::allocator<std::shared_ptr<libcellml::Units>>>>,libcellml::Model::ModelImpl::findUnits(std::shared_ptr<libcellml::Units>const&)const::__0>
                           (local_48,local_50,(anon_class_16_1_a8be468f_for__M_pred *)&local_60);
    findUnits(std::shared_ptr<libcellml::Units>const&)::~__0
              ((findUnits_std__shared_ptr<libcellml::Units>const__ *)&local_60);
  }
  return (const_iterator)(shared_ptr<libcellml::Units> *)this_local;
}

Assistant:

std::vector<UnitsPtr>::const_iterator Model::ModelImpl::findUnits(const UnitsPtr &units) const
{
    auto result = std::find(mUnits.begin(), mUnits.end(), units);
    if (result != mUnits.end()) {
        return result;
    }
    return std::find_if(mUnits.begin(), mUnits.end(),
                        [=](const UnitsPtr &u) -> bool { return u->equals(units); });
}